

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O3

string * anon_unknown.dwarf_19656::getIDLAbsolute
                   (string *__return_storage_ptr__,Type *type,IDLExport *exporter,string *field_name
                   )

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  long lVar2;
  first_finderF<const_char_*,_boost::algorithm::is_equal> Finder;
  iterator_range<const_char_*> FormatResult;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  long *plVar4;
  string *extraout_RAX;
  string *psVar5;
  size_type *psVar6;
  const_formatF<boost::iterator_range<const_char_*>_> Formatter;
  iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  FindResult;
  string ns;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  base;
  undefined1 local_a0 [32];
  string local_80;
  char *local_60;
  char *pcStack_58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  
  getIDLBase(&local_50,type,exporter,field_name);
  if (local_50.first._M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_50.second._M_dataplus._M_p,
               local_50.second._M_dataplus._M_p + local_50.second._M_string_length);
  }
  else {
    local_a0._0_8_ = (anon_unknown_dwarf_19656 *)(local_a0 + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,local_50.first._M_dataplus._M_p,
               local_50.first._M_dataplus._M_p + local_50.first._M_string_length);
    local_80._M_dataplus._M_p = "/";
    local_80._M_string_length = 0x11808b;
    _Var3._M_current = (char *)local_a0._0_8_;
    for (psVar5 = (string *)local_a0._8_8_; psVar5 != (string *)0x0;
        psVar5 = (string *)((long)&psVar5[-1].field_2 + 0xf)) {
      _Var1._M_current = _Var3._M_current + 1;
      if (*_Var3._M_current == '/') {
        if (_Var3._M_current != _Var1._M_current) {
          local_60 = "::";
          pcStack_58 = "";
          Finder.m_Search.
          super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.
          m_End = "";
          Finder.m_Search.
          super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.
          m_Begin = "/";
          Finder._16_8_ = local_80.field_2._M_allocated_capacity;
          FormatResult.
          super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.
          m_End = "";
          FormatResult.
          super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.
          m_Begin = "::";
          Formatter.m_Format.
          super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.
          m_End = "";
          Formatter.m_Format.
          super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.
          m_Begin = "::";
          FindResult.
          super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
          .
          super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
          .
          super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
          .m_End._M_current = _Var1._M_current;
          FindResult.
          super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
          .
          super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
          .
          super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
          .m_Begin._M_current = _Var3._M_current;
          boost::algorithm::detail::
          find_format_all_impl2<std::__cxx11::string,boost::algorithm::detail::first_finderF<char_const*,boost::algorithm::is_equal>,boost::algorithm::detail::const_formatF<boost::iterator_range<char_const*>>,boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,boost::iterator_range<char_const*>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
                     Finder,Formatter,FindResult,FormatResult);
        }
        break;
      }
      _Var3._M_current = _Var1._M_current;
    }
    normalizeIDLName(&local_80,(anon_unknown_dwarf_19656 *)local_a0._0_8_,(string *)local_a0._8_8_);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_80,(ulong)local_50.second._M_dataplus._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar6) {
      lVar2 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if ((anon_unknown_dwarf_19656 *)local_a0._0_8_ != (anon_unknown_dwarf_19656 *)(local_a0 + 0x10))
    {
      operator_delete((void *)local_a0._0_8_);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.second._M_dataplus._M_p != &local_50.second.field_2) {
    operator_delete(local_50.second._M_dataplus._M_p);
  }
  psVar5 = (string *)&local_50.first.field_2;
  if ((string *)local_50.first._M_dataplus._M_p != psVar5) {
    operator_delete(local_50.first._M_dataplus._M_p);
    psVar5 = extraout_RAX;
  }
  return psVar5;
}

Assistant:

static string getIDLAbsolute(Type const& type, IDLExport const& exporter, std::string const& field_name = std::string())
    {
        pair<string, string> base = getIDLBase(type, exporter, field_name);
        if (!base.first.empty())
        {
            std::string ns = base.first;
            boost::replace_all(ns, Typelib::NamespaceMarkString, "::");
            return normalizeIDLName(ns) + base.second;
        }
        else return base.second;
    }